

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeDeltaTo(UCharsTrieBuilder *this,int32_t jumpTarget)

{
  short sVar1;
  ssize_t sVar2;
  size_t in_RCX;
  long lVar3;
  int iVar4;
  UChar intUnits [3];
  undefined8 uStack_8;
  
  iVar4 = this->ucharsLength - jumpTarget;
  if (iVar4 < 0xfc00) {
    iVar4 = (*(this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf])();
    return iVar4;
  }
  sVar1 = (short)((uint)iVar4 >> 0x10);
  uStack_8._0_2_ = (undefined2)jumpTarget;
  if (iVar4 < 0x3ff0000) {
    uStack_8._0_4_ = CONCAT22(sVar1 + -0x400,(undefined2)uStack_8);
    uStack_8 = (ulong)(uint)uStack_8;
    lVar3 = 1;
  }
  else {
    uStack_8._0_4_ = CONCAT22(0xffff,(undefined2)uStack_8);
    uStack_8._0_6_ = CONCAT24(sVar1,(uint)uStack_8);
    uStack_8 = (ulong)(uint6)uStack_8;
    lVar3 = 2;
  }
  *(short *)((long)&uStack_8 + lVar3 * 2 + 2) = (short)iVar4;
  sVar2 = write(this,(int)&uStack_8 + 2,(void *)(ulong)((int)lVar3 + 1),in_RCX);
  return (int32_t)sVar2;
}

Assistant:

int32_t
UCharsTrieBuilder::writeDeltaTo(int32_t jumpTarget) {
    int32_t i=ucharsLength-jumpTarget;
    U_ASSERT(i>=0);
    if(i<=UCharsTrie::kMaxOneUnitDelta) {
        return write(i);
    }
    UChar intUnits[3];
    int32_t length;
    if(i<=UCharsTrie::kMaxTwoUnitDelta) {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitDeltaLead+(i>>16));
        length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitDeltaLead);
        intUnits[1]=(UChar)(i>>16);
        length=2;
    }
    intUnits[length++]=(UChar)i;
    return write(intUnits, length);
}